

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Klex.cpp
# Opt level: O1

string * __thiscall
Klex::parseOutString_abi_cxx11_(string *__return_storage_ptr__,Klex *this,char quote)

{
  int iVar1;
  undefined3 in_register_00000011;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = this->currentChar;
  if (iVar1 != CONCAT31(in_register_00000011,quote) && iVar1 != -1) {
    do {
      if (iVar1 == 0x5c) {
        nextChar(this);
        if ((this->currentChar != 0x74) && (this->currentChar != 0x6e)) {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      nextChar(this);
      iVar1 = this->currentChar;
    } while ((iVar1 != -1) && (iVar1 != CONCAT31(in_register_00000011,quote)));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Klex::parseOutString(char quote) {
    std::string lexeme;

    while(getChar() != EOF && getChar() != quote) {
        if(getChar() == '\\') {
            nextChar();
            if(getChar() == 'n') {
                lexeme.push_back('\n');
            } else if(getChar() == 't') {
                lexeme.push_back('\t');
            } else {
                lexeme.push_back('\\');
                lexeme.push_back(getChar());
            }
        } else {
            lexeme.push_back(getChar());
        }
        nextChar();
    }

    return lexeme;
}